

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

void __thiscall
fasttext::ProductQuantizer::kmeans(ProductQuantizer *this,real *x,real *c,int32_t n,int32_t d)

{
  int32_t d_00;
  int32_t n_00;
  int iVar1;
  pointer piVar2;
  long lVar3;
  int i;
  long lVar4;
  int i_1;
  real *prVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> codes;
  vector<int,_std::allocator<int>_> perm;
  allocator_type local_81;
  int32_t local_80;
  int32_t local_7c;
  real *local_78;
  size_type local_70;
  int *local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_70 = (size_type)n;
  local_60._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,local_70,
             (value_type_conflict2 *)&local_60,&local_81);
  iVar1 = 0;
  for (piVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
      piVar2 != local_48._M_impl.super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
    *piVar2 = iVar1;
    iVar1 = iVar1 + 1;
  }
  local_7c = n;
  local_78 = c;
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_48._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_48._M_impl.super__Vector_impl_data._M_finish,&this->rng);
  lVar3 = (long)d;
  local_68 = local_48._M_impl.super__Vector_impl_data._M_start;
  prVar5 = local_78;
  local_80 = d;
  for (lVar4 = 0; lVar4 < this->ksub_; lVar4 = lVar4 + 1) {
    memcpy(prVar5,x + local_68[lVar4] * lVar3,lVar3 * 4);
    prVar5 = prVar5 + lVar3;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,local_70,
             (allocator_type *)&local_81);
  prVar5 = local_78;
  n_00 = local_7c;
  d_00 = local_80;
  for (iVar1 = 0; iVar1 < this->niter_; iVar1 = iVar1 + 1) {
    Estep(this,x,prVar5,
          (uint8_t *)
          CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,
                   local_60._M_impl.super__Vector_impl_data._M_start._0_4_),d_00,n_00);
    MStep(this,x,prVar5,
          (uint8_t *)
          CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,
                   local_60._M_impl.super__Vector_impl_data._M_start._0_4_),d_00,n_00);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void ProductQuantizer::kmeans(const real* x, real* c, int32_t n, int32_t d) {
  std::vector<int32_t> perm(n, 0);
  std::iota(perm.begin(), perm.end(), 0);
  std::shuffle(perm.begin(), perm.end(), rng);
  for (auto i = 0; i < ksub_; i++) {
    memcpy(&c[i * d], x + perm[i] * d, d * sizeof(real));
  }
  auto codes = std::vector<uint8_t>(n);
  for (auto i = 0; i < niter_; i++) {
    Estep(x, c, codes.data(), d, n);
    MStep(x, c, codes.data(), d, n);
  }
}